

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hxx
# Opt level: O1

void __thiscall
DisplayAction::DisplayAction
          (DisplayAction *this,int n,string *s,offset_in_Display_to_subr sa,
          offset_in_Display_to_subr sn,offset_in_Display_to_subr ss)

{
  offset_in_Display_to_subr in_stack_00000008;
  undefined8 in_stack_00000010;
  offset_in_Display_to_subr in_stack_00000018;
  undefined8 in_stack_00000020;
  
  (this->sString)._M_dataplus._M_p = (pointer)&(this->sString).field_2;
  (this->sString)._M_string_length = 0;
  (this->sString).field_2._M_local_buf[0] = '\0';
  this->nInt = n;
  std::__cxx11::string::_M_assign((string *)&this->sString);
  this->action = sa;
  *(offset_in_Display_to_subr *)&this->field_0x30 = sn;
  this->setInt = in_stack_00000008;
  *(undefined8 *)&this->field_0x40 = in_stack_00000010;
  this->setString = in_stack_00000018;
  *(undefined8 *)&this->field_0x50 = in_stack_00000020;
  return;
}

Assistant:

DisplayAction(
		int n, 
		string s, 
		void (Display::* sa)(), 
		void (Display::* sn)(const int &), 
		void (Display::* ss)(string)
	) {
		nInt = n;
		sString = s;
		action = sa;
		setInt = sn;
		setString = ss;
	}